

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

Token * __thiscall llvm::yaml::Scanner::getNext(Token *__return_storage_ptr__,Scanner *this)

{
  list_type *plVar1;
  Token *pTVar2;
  
  pTVar2 = peekNext(this);
  Token::Token(__return_storage_ptr__,pTVar2);
  plVar1 = &(this->TokenQueue).List;
  if (((this->TokenQueue).List.Sentinel.
       super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
       .super_node_base_type.Prev != (ilist_node_base<false> *)plVar1) &&
     (AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
      ::pop_front(&this->TokenQueue),
     (plVar1->Sentinel).
     super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
     .super_node_base_type.Prev != (ilist_node_base<false> *)plVar1)) {
    return __return_storage_ptr__;
  }
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::resetAlloc(&this->TokenQueue);
  return __return_storage_ptr__;
}

Assistant:

Token Scanner::getNext() {
  Token Ret = peekNext();
  // TokenQueue can be empty if there was an error getting the next token.
  if (!TokenQueue.empty())
    TokenQueue.pop_front();

  // There cannot be any referenced Token's if the TokenQueue is empty. So do a
  // quick deallocation of them all.
  if (TokenQueue.empty())
    TokenQueue.resetAlloc();

  return Ret;
}